

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O3

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::StandardBufferManager::RegisterSmallMemory
          (StandardBufferManager *this,MemoryTag tag,idx_t size)

{
  atomic<long> *paVar1;
  type __args;
  StringUtil *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  StandardBufferManager *this_00;
  shared_ptr<duckdb::BlockHandle,_true> sVar2;
  MemoryTag tag_local;
  DestroyBufferUpon local_92;
  undefined1 local_91;
  _Head_base<0UL,_duckdb::FileBuffer_*,_false> local_90;
  shared_ptr<duckdb::BlockHandle> local_88;
  idx_t size_local;
  long local_70;
  TempBufferPoolReservation reservation;
  string local_50;
  
  this_00 = (StandardBufferManager *)CONCAT71(in_register_00000031,tag);
  tag_local = (MemoryTag)size;
  StringUtil::BytesToHumanReadableString_abi_cxx11_(&local_50,in_RCX,0x400,(idx_t)in_RCX);
  EvictBlocksOrThrow<char_const*,std::__cxx11::string>
            (&reservation,this_00,(MemoryTag)size,(idx_t)in_RCX,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)0x0,
             "could not allocate block of size %s%s",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_88.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (*(this_00->super_BufferManager)._vptr_BufferManager[0x1e])(&local_90,this_00);
  if (local_88.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*(code *)((((local_88.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
                super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::BlockHandle>).__weak_this_.internal.
              super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)()
    ;
  }
  __args = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
           operator*(&this_00->temp_block_manager);
  LOCK();
  paVar1 = &this_00->temporary_id;
  local_70 = (paVar1->super___atomic_base<long>)._M_i;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  local_70 = local_70 + 1;
  local_92 = BLOCK;
  local_88.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::BlockHandle,std::allocator<duckdb::BlockHandle>,duckdb::BlockManager&,long,duckdb::MemoryTag&,duckdb::unique_ptr<duckdb::FileBuffer,std::default_delete<duckdb::FileBuffer>,true>,duckdb::DestroyBufferUpon,unsigned_long_const&,duckdb::TempBufferPoolReservation>
            (&local_88.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(BlockHandle **)&local_88,(allocator<duckdb::BlockHandle> *)&local_91,
             __args,&local_70,&tag_local,
             (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
             &local_90,&local_92,&size_local,&reservation);
  shared_ptr<duckdb::BlockHandle,_true>::shared_ptr
            ((shared_ptr<duckdb::BlockHandle,_true> *)this,&local_88);
  if (local_88.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_90._M_head_impl != (FileBuffer *)0x0) {
    (*(local_90._M_head_impl)->_vptr_FileBuffer[1])();
  }
  TempBufferPoolReservation::~TempBufferPoolReservation(&reservation);
  sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar2.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> StandardBufferManager::RegisterSmallMemory(MemoryTag tag, const idx_t size) {
	D_ASSERT(size < GetBlockSize());
	auto reservation = EvictBlocksOrThrow(tag, size, nullptr, "could not allocate block of size %s%s",
	                                      StringUtil::BytesToHumanReadableString(size));

	auto buffer = ConstructManagedBuffer(size, DEFAULT_BLOCK_HEADER_STORAGE_SIZE, nullptr, FileBufferType::TINY_BUFFER);

	// Create a new block pointer for this block.
	auto result = make_shared_ptr<BlockHandle>(*temp_block_manager, ++temporary_id, tag, std::move(buffer),
	                                           DestroyBufferUpon::BLOCK, size, std::move(reservation));
#ifdef DUCKDB_DEBUG_DESTROY_BLOCKS
	// Initialize the memory with garbage data
	WriteGarbageIntoBuffer(*result);
#endif
	return result;
}